

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmNinjaTargetGenerator::GetObjectFilePath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *config)

{
  string *args_1;
  cmGlobalNinjaGenerator *pcVar1;
  char local_e1;
  char *local_e0;
  size_t local_d8;
  char *local_c0;
  size_t local_b8;
  string local_a0;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)&this->LocalGenerator->HomeRelativeOutputPath);
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  args_1 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget,source);
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[0xe])
            (&local_c0,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_80.View_._M_len = local_b8;
  local_80.View_._M_str = local_c0;
  pcVar1 = GetGlobalGenerator(this);
  (*(pcVar1->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49])
            (&local_e0,pcVar1,config);
  local_50.View_._M_len = local_d8;
  local_50.View_._M_str = local_e0;
  local_e1 = '/';
  cmStrCat<char,std::__cxx11::string>(&local_a0,&local_80,&local_50,&local_e1,args_1);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetObjectFilePath(
  cmSourceFile const* source, const std::string& config) const
{
  std::string path = this->LocalGenerator->GetHomeRelativeOutputPath();
  if (!path.empty()) {
    path += '/';
  }
  std::string const& objectName = this->GeneratorTarget->GetObjectName(source);
  path += cmStrCat(
    this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
    this->GetGlobalGenerator()->ConfigDirectory(config), '/', objectName);
  return path;
}